

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynthWidget.cpp
# Opt level: O0

QIcon * SynthWidget::getSynthDetailsIcon(bool visible)

{
  int iVar1;
  QIcon *local_58;
  QString local_50;
  QString local_28;
  byte local_9;
  bool visible_local;
  
  local_9 = visible;
  if (getSynthDetailsIcon(bool)::SYNTH_DETAILS_VISIBLE == '\0') {
    iVar1 = __cxa_guard_acquire(&getSynthDetailsIcon(bool)::SYNTH_DETAILS_VISIBLE);
    if (iVar1 != 0) {
      QString::QString(&local_28,":/images/DetailsHide.gif");
      QIcon::QIcon((QIcon *)&getSynthDetailsIcon(bool)::SYNTH_DETAILS_VISIBLE,(QString *)&local_28);
      QString::~QString(&local_28);
      __cxa_atexit(QIcon::~QIcon,&getSynthDetailsIcon(bool)::SYNTH_DETAILS_VISIBLE,&__dso_handle);
      __cxa_guard_release(&getSynthDetailsIcon(bool)::SYNTH_DETAILS_VISIBLE);
    }
  }
  if (getSynthDetailsIcon(bool)::SYNTH_DETAILS_HIDDEN == '\0') {
    iVar1 = __cxa_guard_acquire(&getSynthDetailsIcon(bool)::SYNTH_DETAILS_HIDDEN);
    if (iVar1 != 0) {
      QString::QString(&local_50,":/images/Details.gif");
      QIcon::QIcon((QIcon *)&getSynthDetailsIcon(bool)::SYNTH_DETAILS_HIDDEN,(QString *)&local_50);
      QString::~QString(&local_50);
      __cxa_atexit(QIcon::~QIcon,&getSynthDetailsIcon(bool)::SYNTH_DETAILS_HIDDEN,&__dso_handle);
      __cxa_guard_release(&getSynthDetailsIcon(bool)::SYNTH_DETAILS_HIDDEN);
    }
  }
  if ((local_9 & 1) == 0) {
    local_58 = (QIcon *)&getSynthDetailsIcon(bool)::SYNTH_DETAILS_HIDDEN;
  }
  else {
    local_58 = (QIcon *)&getSynthDetailsIcon(bool)::SYNTH_DETAILS_VISIBLE;
  }
  return local_58;
}

Assistant:

const QIcon &SynthWidget::getSynthDetailsIcon(bool visible) {
	static const QIcon SYNTH_DETAILS_VISIBLE(":/images/DetailsHide.gif");
	static const QIcon SYNTH_DETAILS_HIDDEN(":/images/Details.gif");

	return visible ? SYNTH_DETAILS_VISIBLE : SYNTH_DETAILS_HIDDEN;
}